

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateMapEntry
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptor *arg;
  long *plVar1;
  undefined8 *puVar2;
  FieldDescriptor *arg_00;
  int iVar3;
  uint uVar4;
  long *plVar5;
  long *plVar6;
  long *__s2;
  bool bVar7;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40;
  long lStack_38;
  
  if (*(GoogleOnceDynamic **)(field + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
  }
  plVar1 = *(long **)(field + 0x70);
  if ((((((int)plVar1[0xf] == 0) && (*(int *)(field + 0x4c) == 3)) && ((int)plVar1[0xd] == 0)) &&
      (((int)plVar1[9] == 0 && ((int)plVar1[0xb] == 0)))) && (*(int *)((long)plVar1 + 0x2c) == 2)) {
    puVar2 = (undefined8 *)*plVar1;
    anon_unknown_1::ToCamelCase(&local_70,*(string **)field,false);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_40 = *plVar6;
      lStack_38 = plVar5[3];
      __s2 = &local_40;
    }
    else {
      local_40 = *plVar6;
      __s2 = (long *)*plVar5;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    bVar7 = true;
    local_50 = __s2;
    if ((puVar2[1] == local_48) &&
       ((local_48 == 0 || (iVar3 = bcmp((void *)*puVar2,__s2,local_48), iVar3 == 0)))) {
      bVar7 = *(long *)(field + 0x58) != plVar1[3];
    }
    if (__s2 != &local_40) {
      operator_delete(__s2,local_40 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((((!bVar7) && (arg_00 = (FieldDescriptor *)plVar1[6], *(int *)(arg_00 + 0x4c) == 1)) &&
        (*(int *)(arg_00 + 0x38) == 1)) &&
       (((iVar3 = std::__cxx11::string::compare(*(char **)arg_00), iVar3 == 0 &&
         (*(int *)(arg_00 + 0xf4) == 1)) && (*(int *)(arg_00 + 0xe0) == 2)))) {
      arg = arg_00 + 0xa8;
      iVar3 = std::__cxx11::string::compare(*(char **)arg);
      if (iVar3 == 0) {
        if (*(GoogleOnceDynamic **)(arg_00 + 0x40) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (*(GoogleOnceDynamic **)(arg_00 + 0x40),FieldDescriptor::TypeOnceInit,arg_00);
        }
        uVar4 = *(int *)(arg_00 + 0x48) - 1;
        if ((uVar4 < 0xe) && ((0x2e03U >> (uVar4 & 0x1f) & 1) != 0)) {
          AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                   &DAT_003a5ff8 + *(int *)(&DAT_003a5ff8 + (ulong)uVar4 * 4));
        }
        if (*(GoogleOnceDynamic **)(arg_00 + 0xe8) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (*(GoogleOnceDynamic **)(arg_00 + 0xe8),FieldDescriptor::TypeOnceInit,arg);
        }
        if (*(int *)(arg_00 + 0xf0) != 0xe) {
          return true;
        }
        if (*(GoogleOnceDynamic **)(arg_00 + 0xe8) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (*(GoogleOnceDynamic **)(arg_00 + 0xe8),FieldDescriptor::TypeOnceInit,arg);
        }
        if (*(int *)(*(long *)(*(long *)(arg_00 + 0x120) + 0x30) + 0x10) == 0) {
          return true;
        }
        AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                 "Enum value in map must define 0 as the first value.");
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DescriptorBuilder::ValidateMapEntry(FieldDescriptor* field,
                                         const FieldDescriptorProto& proto) {
  const Descriptor* message = field->message_type();
  if (// Must not contain extensions, extension range or nested message or
      // enums
      message->extension_count() != 0 ||
      field->label() != FieldDescriptor::LABEL_REPEATED ||
      message->extension_range_count() != 0 ||
      message->nested_type_count() != 0 || message->enum_type_count() != 0 ||
      // Must contain exactly two fields
      message->field_count() != 2 ||
      // Field name and message name must match
      message->name() != ToCamelCase(field->name(), false) + "Entry" ||
      // Entry message must be in the same containing type of the field.
      field->containing_type() != message->containing_type()) {
    return false;
  }

  const FieldDescriptor* key = message->field(0);
  const FieldDescriptor* value = message->field(1);
  if (key->label() != FieldDescriptor::LABEL_OPTIONAL || key->number() != 1 ||
      key->name() != "key") {
    return false;
  }
  if (value->label() != FieldDescriptor::LABEL_OPTIONAL ||
      value->number() != 2 || value->name() != "value") {
    return false;
  }

  // Check key types are legal.
  switch (key->type()) {
    case FieldDescriptor::TYPE_ENUM:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be enum types.");
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_BYTES:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be float/double, bytes or message types.");
      break;
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      // Legal cases
      break;
    // Do not add a default, so that the compiler will complain when new types
    // are added.
  }

  if (value->type() == FieldDescriptor::TYPE_ENUM) {
    if (value->enum_type()->value(0)->number() != 0) {
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Enum value in map must define 0 as the first value.");
    }
  }

  return true;
}